

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceMinLayerParams::~ReduceMinLayerParams(ReduceMinLayerParams *this)

{
  ReduceMinLayerParams *this_local;
  
  ~ReduceMinLayerParams(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

ReduceMinLayerParams::~ReduceMinLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ReduceMinLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}